

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

char * strippath(char *fullfile)

{
  curl_strdup_callback p_Var1;
  char *__path;
  char *pcVar2;
  char *base;
  char *filename;
  char *fullfile_local;
  
  __path = (*Curl_cstrdup)(fullfile);
  p_Var1 = Curl_cstrdup;
  if (__path == (char *)0x0) {
    fullfile_local = (char *)0x0;
  }
  else {
    pcVar2 = __xpg_basename(__path);
    fullfile_local = (*p_Var1)(pcVar2);
    (*Curl_cfree)(__path);
  }
  return fullfile_local;
}

Assistant:

static char *strippath(const char *fullfile)
{
  char *filename;
  char *base;
  filename = strdup(fullfile); /* duplicate since basename() may ruin the
                                  buffer it works on */
  if(!filename)
    return NULL;
  base = strdup(basename(filename));

  free(filename); /* free temporary buffer */

  return base; /* returns an allocated string or NULL ! */
}